

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O0

sx_job_context * sx_job_create_context(sx_alloc *alloc,sx_job_context_desc *desc)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  uint32_t tid;
  sx_job_context *psVar4;
  sx_tls pvVar5;
  sx__job_thread_data *data;
  sx_fiber_t pvVar6;
  sx_pool *psVar7;
  void *pvVar8;
  size_t sVar9;
  sx_thread *psVar10;
  sx_fiber_stack stack;
  int local_74;
  int local_70;
  int local_6c;
  char local_68 [8];
  char name [32];
  int local_3c;
  int i;
  sx__job_thread_data *main_tdata;
  int max_fibers;
  sx_job_context *ctx;
  sx_job_context_desc *desc_local;
  sx_alloc *alloc_local;
  
  alloc_local = (sx_alloc *)sx__malloc(alloc,0x1c0,0,(char *)0x0,(char *)0x0,0);
  if (alloc_local == (sx_alloc *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",0x233);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x233,"Out of memory");
    pcVar1 = (code *)swi(3);
    psVar4 = (sx_job_context *)(*pcVar1)();
    return psVar4;
  }
  memset(alloc_local,0,0x1c0);
  alloc_local->alloc_cb =
       (_func_void_ptr_void_ptr_size_t_uint32_t_char_ptr_char_ptr_uint32_t_void_ptr *)alloc;
  if (desc->num_threads < 1) {
    local_6c = sx_os_numcores();
    local_6c = local_6c + -1;
  }
  else {
    local_6c = desc->num_threads;
  }
  *(int *)&alloc_local[1].alloc_cb = local_6c;
  pvVar5 = sx_tls_create();
  alloc_local[0xc].user_data = pvVar5;
  if (desc->fiber_stack_sz < 1) {
    local_70 = 0x100000;
  }
  else {
    local_70 = desc->fiber_stack_sz;
  }
  *(int *)((long)&alloc_local[1].alloc_cb + 4) = local_70;
  alloc_local[0x16].user_data = desc->thread_init_cb;
  alloc_local[0x17].alloc_cb =
       (_func_void_ptr_void_ptr_size_t_uint32_t_char_ptr_char_ptr_uint32_t_void_ptr *)
       desc->thread_shutdown_cb;
  alloc_local[0x17].user_data = desc->thread_user_data;
  if (desc->max_fibers < 1) {
    local_74 = 0x40;
  }
  else {
    local_74 = desc->max_fibers;
  }
  sx_semaphore_init((sx_sem *)(alloc_local + 0xe));
  tid = sx_thread_tid();
  data = sx__job_create_tdata(alloc,tid,0,true);
  if (data == (sx__job_thread_data *)0x0) {
    sx__free(alloc,alloc_local,0,(char *)0x0,(char *)0x0,0);
    alloc_local = (sx_alloc *)0x0;
  }
  else {
    sx_tls_set(alloc_local[0xc].user_data,data);
    uVar2 = (data->selector_stack).sptr;
    uVar3 = (data->selector_stack).ssize;
    stack.ssize = uVar3;
    stack.sptr = (void *)uVar2;
    stack._12_4_ = 0;
    pvVar6 = sx_fiber_create(stack,sx__job_selector_main_thrd);
    data->selector_fiber = pvVar6;
    psVar7 = sx__pool_create(alloc,0x78,local_74,
                             "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                             ,
                             "sx_job_context *sx_job_create_context(const sx_alloc *, const sx_job_context_desc *)"
                             ,0x24d);
    alloc_local[1].user_data = psVar7;
    psVar7 = sx__pool_create(alloc,4,0x100,
                             "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                             ,
                             "sx_job_context *sx_job_create_context(const sx_alloc *, const sx_job_context_desc *)"
                             ,0x24e);
    alloc_local[2].alloc_cb =
         (_func_void_ptr_void_ptr_size_t_uint32_t_char_ptr_char_ptr_uint32_t_void_ptr *)psVar7;
    if ((alloc_local[1].user_data == (void *)0x0) ||
       (alloc_local[2].alloc_cb ==
        (_func_void_ptr_void_ptr_size_t_uint32_t_char_ptr_char_ptr_uint32_t_void_ptr *)0x0)) {
      alloc_local = (sx_alloc *)0x0;
    }
    else {
      memset(*(void **)(*(long *)((long)alloc_local[1].user_data + 8) + 8),0,(long)local_74 * 0x78);
      pvVar8 = sx__malloc(alloc,((long)*(int *)&alloc_local[1].alloc_cb + 1) * 4,0,(char *)0x0,
                          (char *)0x0,0);
      alloc_local[5].user_data = pvVar8;
      memset(alloc_local[5].user_data,0xff,((long)*(int *)&alloc_local[1].alloc_cb + 1) * 4);
      if (0 < *(int *)&alloc_local[1].alloc_cb) {
        pvVar8 = sx__malloc(alloc,(long)*(int *)&alloc_local[1].alloc_cb << 3,0,(char *)0x0,
                            (char *)0x0,0);
        alloc_local->user_data = pvVar8;
        if (alloc_local->user_data == (void *)0x0) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                            ,0x25a,"ctx->threads");
          pcVar1 = (code *)swi(3);
          psVar4 = (sx_job_context *)(*pcVar1)();
          return psVar4;
        }
        for (local_3c = 0; local_3c < *(int *)&alloc_local[1].alloc_cb; local_3c = local_3c + 1) {
          sx_snprintf(local_68,0x20,"sx_job_thread(%d)",(ulong)(local_3c + 1));
          sVar9 = sx_os_minstacksz();
          psVar10 = sx_thread_create(alloc,sx__job_thread_fn,alloc_local,(int)sVar9,local_68,
                                     (void *)(long)local_3c);
          *(sx_thread **)((long)alloc_local->user_data + (long)local_3c * 8) = psVar10;
          if (*(long *)((long)alloc_local->user_data + (long)local_3c * 8) == 0) {
            sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                              ,0x261,"sx_thread_create failed!");
            pcVar1 = (code *)swi(3);
            psVar4 = (sx_job_context *)(*pcVar1)();
            return psVar4;
          }
        }
      }
    }
  }
  return (sx_job_context *)alloc_local;
}

Assistant:

sx_job_context* sx_job_create_context(const sx_alloc* alloc, const sx_job_context_desc* desc)
{
    sx_job_context* ctx = (sx_job_context*)sx_malloc(alloc, sizeof(sx_job_context));
    if (!ctx) {
        sx_out_of_memory();
        return NULL;
    }
    sx_memset(ctx, 0x0, sizeof(sx_job_context));

    ctx->alloc = alloc;
    ctx->num_threads = desc->num_threads > 0 ? desc->num_threads : (sx_os_numcores() - 1);
    ctx->thread_tls = sx_tls_create();
    ctx->stack_sz = desc->fiber_stack_sz > 0 ? desc->fiber_stack_sz : DEFAULT_FIBER_STACK_SIZE;
    ctx->thread_init_cb = desc->thread_init_cb;
    ctx->thread_shutdown_cb = desc->thread_shutdown_cb;
    ctx->thread_user = desc->thread_user_data;
    int max_fibers = desc->max_fibers > 0 ? desc->max_fibers : DEFAULT_MAX_FIBERS;

    sx_semaphore_init(&ctx->sem);

    sx__job_thread_data* main_tdata = sx__job_create_tdata(alloc, sx_thread_tid(), 0, true);
    if (!main_tdata) {
        sx_free(alloc, ctx);
        return NULL;
    }
    sx_tls_set(ctx->thread_tls, main_tdata);
    main_tdata->selector_fiber =
        sx_fiber_create(main_tdata->selector_stack, sx__job_selector_main_thrd);

    // pools
    ctx->job_pool = sx_pool_create(alloc, sizeof(sx__job), max_fibers);
    ctx->counter_pool = sx_pool_create(alloc, sizeof(int), COUNTER_POOL_SIZE);
    if (!ctx->job_pool || !ctx->counter_pool)
        return NULL;
    sx_memset(ctx->job_pool->pages->buff, 0x0, sizeof(sx__job) * max_fibers);

    // keep tags in an array for evaluating num_jobs
    ctx->tags = sx_malloc(alloc, sizeof(uint32_t) * ((size_t)ctx->num_threads + 1));
    sx_memset(ctx->tags, 0xff, sizeof(uint32_t) * ((size_t)ctx->num_threads + 1));

    // Worker threads
    if (ctx->num_threads > 0) {
        ctx->threads = (sx_thread**)sx_malloc(alloc, sizeof(sx_thread*) * ctx->num_threads);
        sx_assert(ctx->threads);

        for (int i = 0; i < ctx->num_threads; i++) {
            char name[32];
            sx_snprintf(name, sizeof(name), "sx_job_thread(%d)", i + 1);
            ctx->threads[i] = sx_thread_create(alloc, sx__job_thread_fn, ctx, (int)sx_os_minstacksz(),
                                               name, (void*)(intptr_t)i);
            sx_assertf(ctx->threads[i], "sx_thread_create failed!");
        }
    }

    return ctx;
}